

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collator.cpp
# Opt level: O0

basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> * __thiscall
booster::locale::impl_icu::collate_impl<wchar_t>::do_transform_abi_cxx11_
          (collate_impl<wchar_t> *this,level_type level,wchar_t *b,wchar_t *e)

{
  iterator __beg;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *in_RDI;
  wchar_t *in_stack_00000030;
  wchar_t *in_stack_00000038;
  level_type in_stack_00000044;
  vector<unsigned_char,_std::allocator<unsigned_char>_> tmp;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  allocator<wchar_t> *in_stack_ffffffffffffff98;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
  *in_stack_ffffffffffffffa0;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  in_stack_ffffffffffffffa8;
  
  do_basic_transform((collate_impl<wchar_t> *)
                     tmp.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start,in_stack_00000044,in_stack_00000038,
                     in_stack_00000030);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_RDI);
  __beg = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_RDI);
  this_00 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&stack0xffffffffffffffaf;
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::
  wstring<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
            (in_stack_ffffffffffffffa0,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )__beg._M_current,in_stack_ffffffffffffffa8,in_stack_ffffffffffffff98);
  std::allocator<wchar_t>::~allocator((allocator<wchar_t> *)&stack0xffffffffffffffaf);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(this_00);
  return in_RDI;
}

Assistant:

std::basic_string<CharType> do_transform(level_type level,CharType const *b,CharType const *e) const
                {
                    std::vector<uint8_t> tmp = do_basic_transform(level,b,e);
                    return std::basic_string<CharType>(tmp.begin(),tmp.end());
                }